

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_open_input_string_op(sexp ctx,sexp self,sexp_sint_t n,sexp str)

{
  sexp in_RCX;
  sexp_uint_t in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  sexp res;
  sexp in_stack_ffffffffffffffc8;
  FILE *in_stack_ffffffffffffffd0;
  sexp local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 9)) {
    local_8 = sexp_make_input_port(in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if ((((ulong)local_8 & 3) != 0) || (local_8->tag != 0x13)) {
      (local_8->value).type.cpl = in_RCX;
      (local_8->value).type.setters =
           (sexp)((((in_RCX->value).type.name)->value).flonum_bits + 8 +
                 (long)(in_RCX->value).type.cpl);
      (local_8->value).type.print = (sexp)0x0;
      (local_8->value).port.size = (size_t)(in_RCX->value).type.slots;
      (local_8->value).flonum_bits[0x2a] = '\0';
    }
  }
  else {
    local_8 = sexp_type_exception(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_open_input_string_op (sexp ctx, sexp self, sexp_sint_t n, sexp str) {
  sexp res;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  res = sexp_make_input_port(ctx, NULL, SEXP_FALSE);
  if (sexp_exceptionp(res)) return res;
  sexp_port_cookie(res) = str;
  sexp_port_buf(res) = sexp_string_data(str);
  sexp_port_offset(res) = 0;
  sexp_port_size(res) = sexp_string_size(str);
  sexp_port_binaryp(res) = 0;
  return res;
}